

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O2

bool google::protobuf::stringpiece_internal::operator==(StringPiece x,StringPiece y)

{
  int iVar1;
  size_type len;
  size_t __n;
  bool bVar2;
  
  __n = x.length_;
  if (__n == y.length_) {
    bVar2 = true;
    if (__n != 0 && x.ptr_ != y.ptr_) {
      iVar1 = bcmp(x.ptr_,y.ptr_,__n);
      bVar2 = iVar1 == 0;
    }
    return bVar2;
  }
  return false;
}

Assistant:

inline bool operator==(StringPiece x, StringPiece y) {
  StringPiece::size_type len = x.size();
  if (len != y.size()) {
    return false;
  }

  return x.data() == y.data() || len <= 0 ||
      memcmp(x.data(), y.data(), static_cast<size_t>(len)) == 0;
}